

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_ray * rf_get_mouse_ray(rf_ray *__return_storage_ptr__,rf_sizei screen_size,rf_vec2 mouse_position
                         ,rf_camera3d camera)

{
  double top;
  rf_mat proj;
  rf_mat proj_00;
  rf_mat proj_01;
  rf_mat view;
  rf_mat view_00;
  rf_mat view_01;
  undefined8 in_XMM0_Qb;
  float fVar2;
  undefined1 auVar1 [16];
  undefined8 extraout_XMM0_Qb;
  double right;
  rf_vec3 rVar3;
  rf_vec3 rVar4;
  rf_vec3 v;
  rf_mat result;
  rf_mat mat_view;
  rf_mat local_d8;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  rf_sizei local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  rf_mat local_68;
  undefined8 local_28;
  rf_vec3 source;
  
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->direction).y = 0.0;
  (__return_storage_ptr__->direction).z = 0.0;
  auVar1._0_4_ = mouse_position.x + mouse_position.x;
  auVar1._4_4_ = mouse_position.y + mouse_position.y;
  fVar2 = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar1._8_4_ = (float)in_XMM0_Qb + (float)in_XMM0_Qb;
  auVar1._12_4_ = fVar2 + fVar2;
  uStack_80 = 0;
  local_98._0_4_ = (undefined4)screen_size.width;
  local_98._4_4_ = (undefined4)screen_size.height;
  uStack_90 = 0;
  auVar1 = divps(auVar1,_local_98);
  local_78 = auVar1._0_4_ + -1.0;
  fStack_70 = auVar1._8_4_ + 0.0;
  fStack_6c = auVar1._12_4_ + 0.0;
  fStack_74 = 1.0 - auVar1._4_4_;
  local_88 = screen_size;
  rf_mat_look_at(&local_68,camera.position,camera.target,camera.up);
  local_d8.m9 = 0.0;
  local_d8.m13 = 0.0;
  local_d8.m2 = 0.0;
  local_d8.m6 = 0.0;
  local_d8.m14 = 0.0;
  local_d8.m3 = 0.0;
  local_d8.m7 = 0.0;
  local_d8.m11 = 0.0;
  local_d8.m4 = 0.0;
  local_d8.m8 = 0.0;
  local_d8.m12 = 0.0;
  local_d8.m1 = 0.0;
  local_d8.m0 = 1.0;
  local_d8.m5 = 1.0;
  local_d8.m10 = 1.0;
  local_d8.m15 = 1.0;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    top = (double)camera.fovy * 0.5;
    right = (double)((float)local_98._0_4_ / (float)local_98._4_4_) * top;
    rf_mat_ortho(&local_d8,-right,right,-top,top,0.01,1000.0);
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    rf_mat_perspective(&local_d8,(double)(camera.fovy * 0.017453292),
                       (double)local_88.width / (double)local_88.height,0.01,1000.0);
  }
  proj.m4 = local_d8.m4;
  proj.m0 = local_d8.m0;
  proj.m12 = local_d8.m12;
  proj.m8 = local_d8.m8;
  proj.m5 = local_d8.m5;
  proj.m1 = local_d8.m1;
  proj.m13 = local_d8.m13;
  proj.m9 = local_d8.m9;
  proj.m6 = local_d8.m6;
  proj.m2 = local_d8.m2;
  proj.m14 = local_d8.m14;
  proj.m10 = local_d8.m10;
  proj.m7 = local_d8.m7;
  proj.m3 = local_d8.m3;
  proj.m15 = local_d8.m15;
  proj.m11 = local_d8.m11;
  rVar3.y = fStack_74;
  rVar3.x = local_78;
  view.m8 = local_68.m8;
  view.m12 = local_68.m12;
  view.m0 = local_68.m0;
  view.m4 = local_68.m4;
  view.m1 = local_68.m1;
  view.m5 = local_68.m5;
  view.m9 = local_68.m9;
  view.m13 = local_68.m13;
  view.m2 = local_68.m2;
  view.m6 = local_68.m6;
  view.m10 = local_68.m10;
  view.m14 = local_68.m14;
  view.m3 = local_68.m3;
  view.m7 = local_68.m7;
  view.m11 = local_68.m11;
  view.m15 = local_68.m15;
  rVar3.z = 0.0;
  rVar3 = rf_unproject(rVar3,proj,view);
  uStack_90 = extraout_XMM0_Qb;
  local_98 = (undefined1  [8])rVar3._0_8_;
  local_88.width = (int)rVar3.z;
  proj_00.m4 = local_d8.m4;
  proj_00.m0 = local_d8.m0;
  proj_00.m12 = local_d8.m12;
  proj_00.m8 = local_d8.m8;
  proj_00.m5 = local_d8.m5;
  proj_00.m1 = local_d8.m1;
  proj_00.m13 = local_d8.m13;
  proj_00.m9 = local_d8.m9;
  proj_00.m6 = local_d8.m6;
  proj_00.m2 = local_d8.m2;
  proj_00.m14 = local_d8.m14;
  proj_00.m10 = local_d8.m10;
  proj_00.m7 = local_d8.m7;
  proj_00.m3 = local_d8.m3;
  proj_00.m15 = local_d8.m15;
  proj_00.m11 = local_d8.m11;
  rVar4.y = fStack_74;
  rVar4.x = local_78;
  view_00.m8 = local_68.m8;
  view_00.m12 = local_68.m12;
  view_00.m0 = local_68.m0;
  view_00.m4 = local_68.m4;
  view_00.m1 = local_68.m1;
  view_00.m5 = local_68.m5;
  view_00.m9 = local_68.m9;
  view_00.m13 = local_68.m13;
  view_00.m2 = local_68.m2;
  view_00.m6 = local_68.m6;
  view_00.m10 = local_68.m10;
  view_00.m14 = local_68.m14;
  view_00.m3 = local_68.m3;
  view_00.m7 = local_68.m7;
  view_00.m11 = local_68.m11;
  view_00.m15 = local_68.m15;
  rVar4.z = 1.0;
  rVar3 = rf_unproject(rVar4,proj_00,view_00);
  local_28 = rVar3._0_8_;
  proj_01.m4 = local_d8.m4;
  proj_01.m0 = local_d8.m0;
  proj_01.m12 = local_d8.m12;
  proj_01.m8 = local_d8.m8;
  proj_01.m5 = local_d8.m5;
  proj_01.m1 = local_d8.m1;
  proj_01.m13 = local_d8.m13;
  proj_01.m9 = local_d8.m9;
  proj_01.m6 = local_d8.m6;
  proj_01.m2 = local_d8.m2;
  proj_01.m14 = local_d8.m14;
  proj_01.m10 = local_d8.m10;
  proj_01.m7 = local_d8.m7;
  proj_01.m3 = local_d8.m3;
  proj_01.m15 = local_d8.m15;
  proj_01.m11 = local_d8.m11;
  source.y = fStack_74;
  source.x = local_78;
  view_01.m8 = local_68.m8;
  view_01.m12 = local_68.m12;
  view_01.m0 = local_68.m0;
  view_01.m4 = local_68.m4;
  view_01.m1 = local_68.m1;
  view_01.m5 = local_68.m5;
  view_01.m9 = local_68.m9;
  view_01.m13 = local_68.m13;
  view_01.m2 = local_68.m2;
  view_01.m6 = local_68.m6;
  view_01.m10 = local_68.m10;
  view_01.m14 = local_68.m14;
  view_01.m3 = local_68.m3;
  view_01.m7 = local_68.m7;
  view_01.m11 = local_68.m11;
  view_01.m15 = local_68.m15;
  source.z = -1.0;
  rVar4 = rf_unproject(source,proj_01,view_01);
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    __return_storage_ptr__->position = rVar4;
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    (__return_storage_ptr__->position).z = camera.position.z;
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
  }
  v.x = (float)local_28 - (float)local_98._0_4_;
  v.y = local_28._4_4_ - (float)local_98._4_4_;
  v.z = rVar3.z - (float)local_88.width;
  rVar3 = rf_vec3_normalize(v);
  __return_storage_ptr__->direction = rVar3;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray rf_get_mouse_ray(rf_sizei screen_size, rf_vec2 mouse_position, rf_camera3d camera)
{
    rf_ray ray = {0};

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f * mouse_position.x) / (float) screen_size.width - 1.0f;
    float y = 1.0f - (2.0f * mouse_position.y) / (float) screen_size.height;
    float z = 1.0f;

    // Store values in a vector
    rf_vec3 device_coords = { x, y, z };

    // Calculate view matrix from camera look at
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

        // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    rf_vec3 near_point = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 0.0f}, mat_proj, mat_view);
    rf_vec3 far_point  = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 1.0f}, mat_proj, mat_view);

    // Unproject the mouse cursor in the near plane.
    // We need this as the source position because orthographic projects, compared to perspect doesn't have a
    // convergence point, meaning that the "eye" of the camera is more like a plane than a point.
    rf_vec3 camera_plane_pointer_pos = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, -1.0f}, mat_proj,
                                                    mat_view);

    // Calculate normalized direction vector
    rf_vec3 direction = rf_vec3_normalize(rf_vec3_sub(far_point, near_point));

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        ray.position = camera.position;
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        ray.position = camera_plane_pointer_pos;
    }

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}